

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::SampledSpectrum::ToString_abi_cxx11_(string *__return_storage_ptr__,SampledSpectrum *this)

{
  float *in_RCX;
  long lVar1;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[ ",(allocator<char> *)&local_50);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 4) {
    StringPrintf<float_const&>
              (&local_50,(pbrt *)0x2c92d3a,(char *)((long)(this->values).values + lVar1),in_RCX);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    if (lVar1 != 0xc) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SampledSpectrum::ToString() const {
    std::string str = "[ ";
    for (int i = 0; i < NSpectrumSamples; ++i) {
        str += StringPrintf("%f", values[i]);
        if (i + 1 < NSpectrumSamples)
            str += ", ";
    }
    str += " ]";
    return str;
}